

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
unitStrings_watthours_Test::~unitStrings_watthours_Test(unitStrings_watthours_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitStrings, watthours)
{
    EXPECT_EQ(to_string(precise::A * precise::s), "C");
    EXPECT_EQ(to_string(precise::W * precise::hr), "Wh");
    EXPECT_EQ(to_string(precise::W * precise::hr * precise::iflag), "Wh*flag");
    EXPECT_EQ(to_string(precise::W * precise::hr * precise::m), "Wh*m");
    EXPECT_EQ(to_string(precise::kilo * precise::W * precise::h), "kWh");
    EXPECT_EQ(to_string(precise::mega * precise::W * precise::h), "MWh");
    EXPECT_EQ(to_string(precise::giga * precise::W * precise::h), "GWh");

    auto str = to_string(
        precise::currency / (precise::giga * precise::W * precise::h));
    EXPECT_EQ(str, "$/GWh");

    str = to_string(precise::m * (precise::giga * precise::W * precise::h));
    EXPECT_EQ(str, "GWh*m");
}